

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalMakefile(cmLocalUnixMakefileGenerator3 *this)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  Encoding encoding;
  reference output;
  reference pLVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  cmGlobalUnixMakefileGenerator3 *gg_1;
  allocator<char> local_431;
  value_type local_430;
  _Base_ptr local_410;
  undefined1 local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [8];
  string base_1;
  size_type dot_pos_1;
  undefined1 local_398 [8];
  string base;
  size_type dot_pos;
  LocalObjectEntry *entry;
  iterator __end2;
  iterator __begin2;
  LocalObjectInfo *__range2;
  bool lang_has_assembly;
  bool lang_has_preprocessor;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>
  *localObjectFile;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  *__range1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
  localObjectFiles;
  bool do_assembly_rules;
  bool do_preprocess_rules;
  cmGlobalUnixMakefileGenerator3 *gg;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emittedTargets;
  undefined1 local_2b0 [8];
  cmGeneratedFileStream ruleFileStream;
  string ruleFileNameFull;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string ruleFileName;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  ruleFileName.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"Makefile",&local_31);
  std::allocator<char>::~allocator(&local_31);
  ConvertToFullPath((string *)&ruleFileStream.field_0x240,this,(string *)local_30);
  encoding = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
               _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2b0,(string *)&ruleFileStream.field_0x240,false,encoding
            );
  bVar2 = std::ios::operator!((ios *)(local_2b0 + (long)*(_func_int **)((long)local_2b0 + -0x18)));
  if ((bVar2 & 1) == 0) {
    bVar3 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (!bVar3) {
      cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_2b0,true);
    }
    WriteLocalAllRules(this,(ostream *)local_2b0);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&gg);
    bVar3 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
    if (bVar3) {
      cmGlobalUnixMakefileGenerator3::WriteConvenienceRules
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)local_2b0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gg);
    }
    else {
      WriteLocalMakefileTargets
                (this,(ostream *)local_2b0,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gg);
    }
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
         GetCreatePreprocessedSourceRules(this);
    localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ =
         GetCreateAssemblySourceRules(this);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
           *)&__range1);
    GetLocalObjectFiles(this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                              *)&__range1);
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                      *)&__range1);
    localObjectFile =
         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
            ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
                   *)&__range1);
    while (bVar3 = std::operator!=(&__end1,(_Self *)&localObjectFile), bVar3) {
      output = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
               ::operator*(&__end1);
      WriteObjectConvenienceRule
                (this,(ostream *)local_2b0,"target to build an object file",&output->first,
                 &output->second);
      bVar3 = false;
      bVar1 = false;
      __end2 = std::
               vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
               ::begin(&(output->second).
                        super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                      );
      entry = (LocalObjectEntry *)
              std::
              vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
              ::end(&(output->second).
                     super_vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>
                   );
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
                                         *)&entry), bVar4) {
        pLVar5 = __gnu_cxx::
                 __normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
                 ::operator*(&__end2);
        bVar4 = std::operator==(&pLVar5->Language,"C");
        if ((((bVar4) || (bVar4 = std::operator==(&pLVar5->Language,"CXX"), bVar4)) ||
            (bVar4 = std::operator==(&pLVar5->Language,"CUDA"), bVar4)) ||
           (bVar4 = std::operator==(&pLVar5->Language,"Fortran"), bVar4)) {
          bVar3 = true;
          bVar1 = true;
          break;
        }
        __gnu_cxx::
        __normal_iterator<cmLocalUnixMakefileGenerator3::LocalObjectEntry_*,_std::vector<cmLocalUnixMakefileGenerator3::LocalObjectEntry,_std::allocator<cmLocalUnixMakefileGenerator3::LocalObjectEntry>_>_>
        ::operator++(&__end2);
      }
      if ((bVar3) &&
         ((localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0)) {
        base.field_2._8_8_ = std::__cxx11::string::rfind((char *)output,0x792a2d);
        std::__cxx11::string::substr((ulong)local_398,(ulong)output);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &dot_pos_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_398,".i");
        WriteObjectConvenienceRule
                  (this,(ostream *)local_2b0,"target to preprocess a source file",
                   (string *)&dot_pos_1,&output->second);
        std::__cxx11::string::~string((string *)&dot_pos_1);
        (output->second).HasPreprocessRule = true;
        std::__cxx11::string::~string((string *)local_398);
      }
      if ((bVar1) &&
         ((localObjectFiles._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0)) {
        base_1.field_2._8_8_ = std::__cxx11::string::rfind((char *)output,0x792a2d);
        std::__cxx11::string::substr((ulong)local_3e0,(ulong)output);
        std::operator+(&local_400,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3e0,".s");
        WriteObjectConvenienceRule
                  (this,(ostream *)local_2b0,"target to generate assembly for a file",&local_400,
                   &output->second);
        std::__cxx11::string::~string((string *)&local_400);
        (output->second).HasAssembleRule = true;
        std::__cxx11::string::~string((string *)local_3e0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>
      ::operator++(&__end1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"help",&local_431);
    pVar6 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&gg,&local_430);
    local_410 = (_Base_ptr)pVar6.first._M_node;
    local_408 = pVar6.second;
    std::__cxx11::string::~string((string *)&local_430);
    std::allocator<char>::~allocator(&local_431);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      cmGlobalUnixMakefileGenerator3::WriteHelpRule
                ((cmGlobalUnixMakefileGenerator3 *)
                 (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator,
                 (ostream *)local_2b0,this);
    }
    WriteSpecialTargetsBottom(this,(ostream *)local_2b0);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmLocalUnixMakefileGenerator3::LocalObjectInfo>_>_>
            *)&__range1);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gg);
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  }
  else {
    emittedTargets._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2b0);
  std::__cxx11::string::~string((string *)&ruleFileStream.field_0x240);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalMakefile()
{
  // generate the includes
  std::string ruleFileName = "Makefile";

  // Open the rule file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  std::string ruleFileNameFull = this->ConvertToFullPath(ruleFileName);
  cmGeneratedFileStream ruleFileStream(
    ruleFileNameFull, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!ruleFileStream) {
    return;
  }
  // always write the top makefile
  if (!this->IsRootMakefile()) {
    ruleFileStream.SetCopyIfDifferent(true);
  }

  // write the all rules
  this->WriteLocalAllRules(ruleFileStream);

  // only write local targets unless at the top Keep track of targets already
  // listed.
  std::set<std::string> emittedTargets;
  if (!this->IsRootMakefile()) {
    // write our targets, and while doing it collect up the object
    // file rules
    this->WriteLocalMakefileTargets(ruleFileStream, emittedTargets);
  } else {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteConvenienceRules(ruleFileStream, emittedTargets);
  }

  bool do_preprocess_rules = this->GetCreatePreprocessedSourceRules();
  bool do_assembly_rules = this->GetCreateAssemblySourceRules();

  std::map<std::string, LocalObjectInfo> localObjectFiles;
  this->GetLocalObjectFiles(localObjectFiles);

  // now write out the object rules
  // for each object file name
  for (auto& localObjectFile : localObjectFiles) {
    // Add a convenience rule for building the object file.
    this->WriteObjectConvenienceRule(
      ruleFileStream, "target to build an object file", localObjectFile.first,
      localObjectFile.second);

    // Check whether preprocessing and assembly rules make sense.
    // They make sense only for C and C++ sources.
    bool lang_has_preprocessor = false;
    bool lang_has_assembly = false;

    for (LocalObjectEntry const& entry : localObjectFile.second) {
      if (entry.Language == "C" || entry.Language == "CXX" ||
          entry.Language == "CUDA" || entry.Language == "Fortran") {
        // Right now, C, C++, Fortran and CUDA have both a preprocessor and the
        // ability to generate assembly code
        lang_has_preprocessor = true;
        lang_has_assembly = true;
        break;
      }
    }

    // Add convenience rules for preprocessed and assembly files.
    if (lang_has_preprocessor && do_preprocess_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(ruleFileStream,
                                       "target to preprocess a source file",
                                       (base + ".i"), localObjectFile.second);
      localObjectFile.second.HasPreprocessRule = true;
    }

    if (lang_has_assembly && do_assembly_rules) {
      std::string::size_type dot_pos = localObjectFile.first.rfind(".");
      std::string base = localObjectFile.first.substr(0, dot_pos);
      this->WriteObjectConvenienceRule(
        ruleFileStream, "target to generate assembly for a file",
        (base + ".s"), localObjectFile.second);
      localObjectFile.second.HasAssembleRule = true;
    }
  }

  // add a help target as long as there isn;t a real target named help
  if (emittedTargets.insert("help").second) {
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    gg->WriteHelpRule(ruleFileStream, this);
  }

  this->WriteSpecialTargetsBottom(ruleFileStream);
}